

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_writer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::AddFile
          (ImportWriter *this,FileDescriptor *file,string *header_extension)

{
  size_type sVar1;
  bool bVar2;
  FileDescriptor *file_00;
  AlphaNum *this_00;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  string module_name;
  undefined1 local_148 [64];
  AlphaNum local_108;
  string_view local_d8;
  string local_a8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  this_00 = (AlphaNum *)local_148;
  bVar2 = IsProtobufLibraryBundledProtoFile(file);
  if (bVar2) {
    if (this->for_bundled_proto_ != true) {
      return;
    }
    local_d8 = absl::lts_20250127::NullSafeStringView("GPB");
    FilePathBasename_abi_cxx11_(&local_a8,(objectivec *)file,(FileDescriptor *)local_d8._M_str);
    local_108.piece_._M_str = local_a8._M_dataplus._M_p;
    local_108.piece_._M_len = local_a8._M_string_length;
    local_58.piece_._M_str = (header_extension->_M_dataplus)._M_p;
    local_58.piece_._M_len = header_extension->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_88,(lts_20250127 *)&local_d8,&local_108,&local_58,in_R8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->protobuf_imports_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    this_00 = &local_88;
  }
  else {
    ModuleForFile_abi_cxx11_(&local_a8,this,file);
    if (local_a8._M_string_length == 0) {
      sVar1 = (this->generate_for_named_framework_)._M_string_length;
      if (sVar1 == 0) {
        FilePath_abi_cxx11_((string *)&local_108,(objectivec *)file,file_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_108,header_extension);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->other_imports_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        this_00 = &local_108;
        goto LAB_00245daf;
      }
      local_d8._M_str = (this->generate_for_named_framework_)._M_dataplus._M_p;
      local_d8._M_len = sVar1;
      local_108.piece_ = absl::lts_20250127::NullSafeStringView("/");
      FilePathBasename_abi_cxx11_
                ((string *)local_148,(objectivec *)file,(FileDescriptor *)local_108.piece_._M_str);
      local_58.piece_._M_len = local_148._8_8_;
      local_58.piece_._M_str = (char *)local_148._0_8_;
      local_88.piece_._M_str = (header_extension->_M_dataplus)._M_p;
      local_88.piece_._M_len = header_extension->_M_string_length;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)(local_148 + 0x20),(lts_20250127 *)&local_d8,&local_108,&local_58,
                 &local_88,in_R9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_148 + 0x20));
    }
    else {
      local_d8._M_str = local_a8._M_dataplus._M_p;
      local_d8._M_len = local_a8._M_string_length;
      local_108.piece_ = absl::lts_20250127::NullSafeStringView("/");
      FilePathBasename_abi_cxx11_
                ((string *)local_148,(objectivec *)file,(FileDescriptor *)local_108.piece_._M_str);
      local_58.piece_._M_len = local_148._8_8_;
      local_58.piece_._M_str = (char *)local_148._0_8_;
      local_88.piece_._M_str = (header_extension->_M_dataplus)._M_p;
      local_88.piece_._M_len = header_extension->_M_string_length;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)(local_148 + 0x20),(lts_20250127 *)&local_d8,&local_108,&local_58,
                 &local_88,in_R9);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->other_framework_imports_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_148 + 0x20));
    }
    std::__cxx11::string::~string((string *)(local_148 + 0x20));
  }
LAB_00245daf:
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void ImportWriter::AddFile(const FileDescriptor* file,
                           const std::string& header_extension) {
  if (IsProtobufLibraryBundledProtoFile(file)) {
    // The imports of the WKTs are only needed within the library itself,
    // in other cases, they get skipped because the generated code already
    // import GPBProtocolBuffers.h and hence proves them.
    if (for_bundled_proto_) {
      protobuf_imports_.emplace_back(
          absl::StrCat("GPB", FilePathBasename(file), header_extension));
    }
    return;
  }

  auto module_name = ModuleForFile(file);

  if (!module_name.empty()) {
    other_framework_imports_.emplace_back(absl::StrCat(
        module_name, "/", FilePathBasename(file), header_extension));
    return;
  }

  if (!generate_for_named_framework_.empty()) {
    other_framework_imports_.push_back(
        absl::StrCat(generate_for_named_framework_, "/", FilePathBasename(file),
                     header_extension));
    return;
  }

  other_imports_.push_back(FilePath(file) + header_extension);
}